

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

float rsg::RelationalOp<rsg::ComputeGreaterOrEqualRange,_rsg::EvaluateGreaterOrEqual>::getWeight
                (GeneratorState *state,ConstValueRangeAccess valueRange)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  ProgramParameters *pPVar4;
  VariableType *pVVar5;
  GeneratorState *state_local;
  
  pPVar4 = GeneratorState::getProgramParameters(state);
  if ((pPVar4->useComparisonOps & 1U) == 0) {
    return 0.0;
  }
  pVVar5 = ConstValueRangeAccess::getType(&valueRange);
  bVar1 = VariableType::isVoid(pVVar5);
  if (bVar1) {
LAB_001dece1:
    state_local._4_4_ = BinaryOp<7,_(rsg::Associativity)0>::getWeight(state,valueRange);
  }
  else {
    pVVar5 = ConstValueRangeAccess::getType(&valueRange);
    TVar2 = VariableType::getBaseType(pVVar5);
    if (TVar2 == TYPE_BOOL) {
      pVVar5 = ConstValueRangeAccess::getType(&valueRange);
      iVar3 = VariableType::getNumElements(pVVar5);
      if (iVar3 == 1) goto LAB_001dece1;
    }
    state_local._4_4_ = 0.0;
  }
  return state_local._4_4_;
}

Assistant:

float RelationalOp<ComputeValueRange, EvaluateComp>::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (!state.getProgramParameters().useComparisonOps)
		return 0.0f;

	if (valueRange.getType().isVoid() ||
		(valueRange.getType().getBaseType() == VariableType::TYPE_BOOL && valueRange.getType().getNumElements() == 1))
		return BinaryOp<7, ASSOCIATIVITY_LEFT>::getWeight(state, valueRange);
	else
		return 0.0f;
}